

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O0

int ReconstructIntra16(VP8EncIterator *it,VP8ModeScore *rd,uint8_t *yuv_out,int mode)

{
  ushort uVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  int iVar4;
  VP8Matrix *pVVar5;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  VP8EncIterator *in_RDI;
  int non_zero;
  int ctx;
  int y;
  int x;
  int16_t dc_tmp [16];
  int16_t tmp [16] [16];
  int n;
  int nz;
  VP8SegmentInfo *dqm;
  uint8_t *src;
  uint8_t *ref;
  VP8Encoder *enc;
  int local_270;
  int local_26c;
  int16_t local_268 [16];
  int16_t local_248 [208];
  VP8Matrix *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int16_t *in_stack_ffffffffffffff68;
  int16_t *in_stack_ffffffffffffff70;
  VP8Encoder *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff90;
  int local_48;
  uint local_44;
  
  puVar2 = in_RDI->yuv_p_;
  uVar1 = VP8I16ModeOffsets[in_ECX];
  puVar3 = in_RDI->yuv_in_;
  pVVar5 = &in_RDI->enc_->dqm_[*(byte *)in_RDI->mb_ >> 5 & 3].y1_;
  for (local_48 = 0; local_48 < 0x10; local_48 = local_48 + 2) {
    (*VP8FTransform2)(puVar3 + (int)(uint)VP8Scan[local_48],
                      puVar2 + (long)(int)(uint)VP8Scan[local_48] + (long)(int)(uint)uVar1,
                      local_248 + (long)local_48 * 0x10);
  }
  (*VP8FTransformWHT)(local_248,local_268);
  iVar4 = (*VP8EncQuantizeBlockWHT)(local_268,(int16_t *)(in_RSI + 0x28),pVVar5 + 1);
  local_44 = iVar4 << 0x18;
  if (in_RDI->do_trellis_ == 0) {
    for (local_48 = 0; local_48 < 0x10; local_48 = local_48 + 2) {
      local_248[(long)(local_48 + 1) * 0x10] = 0;
      local_248[(long)local_48 * 0x10] = 0;
      iVar4 = (*VP8EncQuantize2Blocks)
                        (local_248 + (long)local_48 * 0x10,
                         (int16_t *)(in_RSI + 0x48 + (long)local_48 * 0x20),pVVar5);
      local_44 = iVar4 << ((byte)local_48 & 0x1f) | local_44;
    }
  }
  else {
    VP8IteratorNzToBytes(in_RDI);
    local_48 = 0;
    for (local_270 = 0; local_270 < 4; local_270 = local_270 + 1) {
      for (local_26c = 0; local_26c < 4; local_26c = local_26c + 1) {
        iVar4 = TrellisQuantizeBlock
                          (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                           in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                           in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                           in_stack_ffffffffffffff90);
        in_RDI->left_nz_[local_270] = iVar4;
        in_RDI->top_nz_[local_26c] = iVar4;
        *(undefined2 *)(in_RSI + 0x48 + (long)local_48 * 0x20) = 0;
        local_44 = iVar4 << ((byte)local_48 & 0x1f) | local_44;
        local_48 = local_48 + 1;
      }
    }
  }
  (*VP8TransformWHT)(local_268,local_248);
  for (local_48 = 0; local_48 < 0x10; local_48 = local_48 + 2) {
    (*VP8ITransform)(puVar2 + (long)(int)(uint)VP8Scan[local_48] + (long)(int)(uint)uVar1,
                     local_248 + (long)local_48 * 0x10,
                     (uint8_t *)(in_RDX + (int)(uint)VP8Scan[local_48]),1);
  }
  return local_44;
}

Assistant:

static int ReconstructIntra16(VP8EncIterator* WEBP_RESTRICT const it,
                              VP8ModeScore* WEBP_RESTRICT const rd,
                              uint8_t* WEBP_RESTRICT const yuv_out,
                              int mode) {
  const VP8Encoder* const enc = it->enc_;
  const uint8_t* const ref = it->yuv_p_ + VP8I16ModeOffsets[mode];
  const uint8_t* const src = it->yuv_in_ + Y_OFF_ENC;
  const VP8SegmentInfo* const dqm = &enc->dqm_[it->mb_->segment_];
  int nz = 0;
  int n;
  int16_t tmp[16][16], dc_tmp[16];

  for (n = 0; n < 16; n += 2) {
    VP8FTransform2(src + VP8Scan[n], ref + VP8Scan[n], tmp[n]);
  }
  VP8FTransformWHT(tmp[0], dc_tmp);
  nz |= VP8EncQuantizeBlockWHT(dc_tmp, rd->y_dc_levels, &dqm->y2_) << 24;

  if (DO_TRELLIS_I16 && it->do_trellis_) {
    int x, y;
    VP8IteratorNzToBytes(it);
    for (y = 0, n = 0; y < 4; ++y) {
      for (x = 0; x < 4; ++x, ++n) {
        const int ctx = it->top_nz_[x] + it->left_nz_[y];
        const int non_zero = TrellisQuantizeBlock(
            enc, tmp[n], rd->y_ac_levels[n], ctx, TYPE_I16_AC, &dqm->y1_,
            dqm->lambda_trellis_i16_);
        it->top_nz_[x] = it->left_nz_[y] = non_zero;
        rd->y_ac_levels[n][0] = 0;
        nz |= non_zero << n;
      }
    }
  } else {
    for (n = 0; n < 16; n += 2) {
      // Zero-out the first coeff, so that: a) nz is correct below, and
      // b) finding 'last' non-zero coeffs in SetResidualCoeffs() is simplified.
      tmp[n][0] = tmp[n + 1][0] = 0;
      nz |= VP8EncQuantize2Blocks(tmp[n], rd->y_ac_levels[n], &dqm->y1_) << n;
      assert(rd->y_ac_levels[n + 0][0] == 0);
      assert(rd->y_ac_levels[n + 1][0] == 0);
    }
  }

  // Transform back
  VP8TransformWHT(dc_tmp, tmp[0]);
  for (n = 0; n < 16; n += 2) {
    VP8ITransform(ref + VP8Scan[n], tmp[n], yuv_out + VP8Scan[n], 1);
  }

  return nz;
}